

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::BasicWriter<char>::write_int<unsigned_long_long,fmt::FormatSpec>
          (BasicWriter<char> *this,unsigned_long_long value,FormatSpec spec)

{
  ThousandsSep thousands_sep;
  StringRef sep_00;
  unsigned_long value_00;
  bool bVar1;
  char cVar2;
  CharPtr pcVar3;
  lconv *plVar4;
  size_t sVar5;
  uint uVar6;
  char *pcVar7;
  char *local_108;
  undefined1 local_f9;
  ThousandsSep local_d8;
  char *local_c0;
  CharPtr p_4;
  uint size;
  char *local_a8;
  undefined1 local_a0 [8];
  StringRef sep;
  char *pcStack_88;
  uint num_digits_4;
  char *p_3;
  ulong uStack_78;
  uint num_digits_3;
  UnsignedType n_2;
  char *p_2;
  ulong uStack_60;
  uint num_digits_2;
  UnsignedType n_1;
  char *digits;
  char *p_1;
  ulong uStack_40;
  uint num_digits_1;
  UnsignedType n;
  CharPtr p;
  uint num_digits;
  char prefix [4];
  UnsignedType abs_value;
  uint prefix_size;
  unsigned_long_long value_local;
  BasicWriter<char> *this_local;
  
  abs_value._4_4_ = 0;
  _num_digits = value;
  memset((void *)((long)&p + 4),0,4);
  bVar1 = internal::is_negative<unsigned_long_long>(value);
  if (bVar1) {
    p._4_1_ = 0x2d;
    abs_value._4_4_ = 1;
    _num_digits = -_num_digits;
  }
  else {
    bVar1 = FormatSpec::flag(&spec,1);
    if (bVar1) {
      bVar1 = FormatSpec::flag(&spec,2);
      local_f9 = 0x2b;
      if (!bVar1) {
        local_f9 = 0x20;
      }
      p._4_1_ = local_f9;
      abs_value._4_4_ = 1;
    }
  }
  cVar2 = FormatSpec::type(&spec);
  if (cVar2 == '\0') {
LAB_001f4afc:
    p._0_4_ = internal::count_digits(_num_digits);
    pcVar3 = prepare_int_buffer<fmt::FormatSpec>
                       (this,(uint)p,&spec,(char *)((long)&p + 4),abs_value._4_4_);
    pcVar7 = get(pcVar3 + 1);
    internal::format_decimal<unsigned_long,char>(pcVar7,_num_digits,0);
    return;
  }
  if (cVar2 == 'B') {
LAB_001f4c64:
    uStack_60 = _num_digits;
    bVar1 = FormatSpec::flag(&spec,8);
    if (bVar1) {
      uVar6 = abs_value._4_4_ + 1;
      *(undefined1 *)((long)&p + (ulong)abs_value._4_4_ + 4) = 0x30;
      cVar2 = FormatSpec::type_prefix(&spec);
      abs_value._4_4_ = abs_value._4_4_ + 2;
      *(char *)((long)&p + (ulong)uVar6 + 4) = cVar2;
    }
    p_2._4_4_ = 0;
    do {
      p_2._4_4_ = p_2._4_4_ + 1;
      uStack_60 = uStack_60 >> 1;
    } while (uStack_60 != 0);
    pcVar3 = prepare_int_buffer<fmt::FormatSpec>
                       (this,p_2._4_4_,&spec,(char *)((long)&p + 4),abs_value._4_4_);
    n_2 = (UnsignedType)get(pcVar3);
    uStack_60 = _num_digits;
    do {
      *(byte *)n_2 = ((byte)uStack_60 & 1) + 0x30;
      uStack_60 = uStack_60 >> 1;
      n_2 = n_2 - 1;
    } while (uStack_60 != 0);
  }
  else {
    if (cVar2 != 'X') {
      if (cVar2 == 'b') goto LAB_001f4c64;
      if (cVar2 == 'd') goto LAB_001f4afc;
      if (cVar2 == 'n') {
        sep.size_._4_4_ = internal::count_digits(_num_digits);
        BasicStringRef<char>::BasicStringRef((BasicStringRef<char> *)local_a0,"");
        plVar4 = localeconv();
        internal::LConvCheck<char_*lconv::*,_&lconv::thousands_sep>::LConvCheck
                  ((LConvCheck<char_*lconv::*,_&lconv::thousands_sep> *)((long)&p_4 + 7),0);
        _size = internal::thousands_sep<lconv>(plVar4);
        uVar6 = sep.size_._4_4_;
        local_a0 = (undefined1  [8])_size;
        sep.data_ = local_a8;
        sVar5 = BasicStringRef<char>::size((BasicStringRef<char> *)local_a0);
        p_4._0_4_ = uVar6 + (int)sVar5 * ((sep.size_._4_4_ - 1) / 3);
        pcVar3 = prepare_int_buffer<fmt::FormatSpec>
                           (this,(uint)p_4,&spec,(char *)((long)&p + 4),abs_value._4_4_);
        local_c0 = pcVar3 + 1;
        pcVar7 = get(local_c0);
        value_00 = _num_digits;
        sep_00.size_ = (size_t)sep.data_;
        sep_00.data_ = (char *)local_a0;
        internal::ThousandsSep::ThousandsSep(&local_d8,sep_00);
        thousands_sep.sep_.size_ = local_d8.sep_.size_;
        thousands_sep.sep_.data_ = local_d8.sep_.data_;
        thousands_sep.digit_index_ = local_d8.digit_index_;
        thousands_sep._20_4_ = local_d8._20_4_;
        internal::format_decimal<unsigned_long,char,fmt::internal::ThousandsSep>
                  (pcVar7,value_00,0,thousands_sep);
        return;
      }
      if (cVar2 == 'o') {
        uStack_78 = _num_digits;
        bVar1 = FormatSpec::flag(&spec,8);
        if (bVar1) {
          *(undefined1 *)((long)&p + (ulong)abs_value._4_4_ + 4) = 0x30;
          abs_value._4_4_ = abs_value._4_4_ + 1;
        }
        p_3._4_4_ = 0;
        do {
          p_3._4_4_ = p_3._4_4_ + 1;
          uStack_78 = uStack_78 >> 3;
        } while (uStack_78 != 0);
        pcVar3 = prepare_int_buffer<fmt::FormatSpec>
                           (this,p_3._4_4_,&spec,(char *)((long)&p + 4),abs_value._4_4_);
        pcStack_88 = get(pcVar3);
        uStack_78 = _num_digits;
        do {
          *pcStack_88 = ((byte)uStack_78 & 7) + 0x30;
          uStack_78 = uStack_78 >> 3;
          pcStack_88 = pcStack_88 + -1;
        } while (uStack_78 != 0);
        return;
      }
      if (cVar2 != 'x') {
        cVar2 = FormatSpec::type(&spec);
        bVar1 = FormatSpec::flag(&spec,0x10);
        pcVar7 = "integer";
        if (bVar1) {
          pcVar7 = "char";
        }
        internal::report_unknown_type(cVar2,pcVar7);
      }
    }
    uStack_40 = _num_digits;
    bVar1 = FormatSpec::flag(&spec,8);
    if (bVar1) {
      uVar6 = abs_value._4_4_ + 1;
      *(undefined1 *)((long)&p + (ulong)abs_value._4_4_ + 4) = 0x30;
      cVar2 = FormatSpec::type_prefix(&spec);
      abs_value._4_4_ = abs_value._4_4_ + 2;
      *(char *)((long)&p + (ulong)uVar6 + 4) = cVar2;
    }
    p_1._4_4_ = 0;
    do {
      p_1._4_4_ = p_1._4_4_ + 1;
      uStack_40 = uStack_40 >> 4;
    } while (uStack_40 != 0);
    pcVar3 = prepare_int_buffer<fmt::FormatSpec>
                       (this,p_1._4_4_,&spec,(char *)((long)&p + 4),abs_value._4_4_);
    digits = get(pcVar3);
    uStack_40 = _num_digits;
    cVar2 = FormatSpec::type(&spec);
    if (cVar2 == 'x') {
      local_108 = "0123456789abcdef";
    }
    else {
      local_108 = "0123456789ABCDEF";
    }
    do {
      *digits = local_108[uStack_40 & 0xf];
      uStack_40 = uStack_40 >> 4;
      digits = digits + -1;
    } while (uStack_40 != 0);
  }
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec)
{
    unsigned prefix_size = 0;
    typedef typename internal::IntTraits<T>::MainType UnsignedType;
    UnsignedType abs_value = static_cast<UnsignedType>(value);
    char prefix[4] = "";
    if (internal::is_negative(value))
    {
        prefix[0] = '-';
        ++prefix_size;
        abs_value = 0 - abs_value;
    }
    else if (spec.flag(SIGN_FLAG))
    {
        prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
        ++prefix_size;
    }
    switch (spec.type())
    {
    case 0:
    case 'd':
    {
        unsigned num_digits = internal::count_digits(abs_value);
        CharPtr p = prepare_int_buffer(num_digits, spec, prefix, prefix_size) + 1;
        internal::format_decimal(get(p), abs_value, 0);
        break;
    }
    case 'x':
    case 'X':
    {
        UnsignedType n = abs_value;
        if (spec.flag(HASH_FLAG))
        {
            prefix[prefix_size++] = '0';
            prefix[prefix_size++] = spec.type_prefix();
        }
        unsigned num_digits = 0;
        do
        {
            ++num_digits;
        } while ((n >>= 4) != 0);
        Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
        n = abs_value;
        const char *digits = spec.type() == 'x' ? "0123456789abcdef" : "0123456789ABCDEF";
        do
        {
            *p-- = digits[n & 0xf];
        } while ((n >>= 4) != 0);
        break;
    }
    case 'b':
    case 'B':
    {
        UnsignedType n = abs_value;
        if (spec.flag(HASH_FLAG))
        {
            prefix[prefix_size++] = '0';
            prefix[prefix_size++] = spec.type_prefix();
        }
        unsigned num_digits = 0;
        do
        {
            ++num_digits;
        } while ((n >>= 1) != 0);
        Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
        n = abs_value;
        do
        {
            *p-- = static_cast<Char>('0' + (n & 1));
        } while ((n >>= 1) != 0);
        break;
    }
    case 'o':
    {
        UnsignedType n = abs_value;
        if (spec.flag(HASH_FLAG))
            prefix[prefix_size++] = '0';
        unsigned num_digits = 0;
        do
        {
            ++num_digits;
        } while ((n >>= 3) != 0);
        Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
        n = abs_value;
        do
        {
            *p-- = static_cast<Char>('0' + (n & 7));
        } while ((n >>= 3) != 0);
        break;
    }
    case 'n':
    {
        unsigned num_digits = internal::count_digits(abs_value);
        fmt::StringRef sep = "";
#if !(defined(ANDROID) || defined(__ANDROID__))
        sep = internal::thousands_sep(std::localeconv());
#endif
        unsigned size = static_cast<unsigned>(num_digits + sep.size() * ((num_digits - 1) / 3));
        CharPtr p = prepare_int_buffer(size, spec, prefix, prefix_size) + 1;
        internal::format_decimal(get(p), abs_value, 0, internal::ThousandsSep(sep));
        break;
    }
    default:
        internal::report_unknown_type(spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
        break;
    }
}